

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

CURLcode Curl_auth_create_digest_md5_message
                   (Curl_easy *data,bufref *chlg,char *userp,char *passwdp,char *service,bufref *out
                   )

{
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  uint uVar4;
  uchar *puVar5;
  size_t sVar6;
  MD5_context *pMVar7;
  size_t sVar8;
  byte bVar9;
  char *pcVar10;
  long lVar11;
  char **linep;
  Curl_str *out_00;
  bool bVar12;
  char qop [5];
  uchar digest [16];
  char nonceCount [9];
  char method [13];
  char cnonce [33];
  char nonce [64];
  char resp_hash_hex [33];
  char HA2_hex [33];
  char HA1_hex [33];
  char algorithm [64];
  char realm [128];
  char qop_options [64];
  
  builtin_strncpy(nonceCount,"00000001",9);
  builtin_strncpy(method + 8,"CATE",5);
  builtin_strncpy(method,"AUTHENTI",8);
  builtin_strncpy(qop,"auth",5);
  puVar5 = Curl_bufref_ptr(chlg);
  sVar6 = Curl_bufref_len(chlg);
  CVar3 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar6 != 0) &&
     (_Var1 = auth_digest_get_key_value((char *)puVar5,"nonce=\"",nonce,0x40,'\"'), _Var1)) {
    _Var1 = auth_digest_get_key_value((char *)puVar5,"realm=\"",realm,0x80,'\"');
    if (!_Var1) {
      realm[0] = '\0';
    }
    _Var1 = auth_digest_get_key_value((char *)puVar5,"algorithm=",algorithm,0x40,',');
    if (_Var1) {
      _Var1 = auth_digest_get_key_value((char *)puVar5,"qop=\"",qop_options,0x40,'\"');
      if ((_Var1) && (iVar2 = bcmp(algorithm,"md5-sess",9), iVar2 == 0)) {
        linep = (char **)HA2_hex;
        bVar12 = false;
        out_00 = (Curl_str *)HA1_hex;
        HA2_hex._0_8_ = qop_options;
        do {
          iVar2 = Curl_str_until(linep,out_00,0x20,',');
          if (iVar2 != 0) break;
          iVar2 = Curl_str_casecompare(out_00,"auth");
          bVar9 = 1;
          if (iVar2 == 0) {
            iVar2 = Curl_str_casecompare(out_00,"auth-int");
            bVar9 = 0;
            if (iVar2 != 0) goto LAB_00163659;
            iVar2 = Curl_str_casecompare(out_00,"auth-conf");
            bVar9 = 0;
            if (iVar2 != 0) goto LAB_00163659;
          }
          else {
LAB_00163659:
            bVar12 = (bool)(bVar12 | bVar9);
          }
          iVar2 = Curl_str_single(linep,',');
        } while (iVar2 == 0);
        if ((bVar12) && (CVar3 = Curl_rand_hex(data,(uchar *)cnonce,0x21), CVar3 == CURLE_OK)) {
          pMVar7 = Curl_MD5_init(&Curl_DIGEST_MD5);
          CVar3 = CURLE_OUT_OF_MEMORY;
          if (pMVar7 != (MD5_context *)0x0) {
            sVar8 = strlen(userp);
            uVar4 = curlx_uztoui(sVar8);
            Curl_MD5_update(pMVar7,(uchar *)userp,uVar4);
            Curl_MD5_update(pMVar7,":",1);
            sVar8 = strlen(realm);
            uVar4 = curlx_uztoui(sVar8);
            Curl_MD5_update(pMVar7,(uchar *)realm,uVar4);
            Curl_MD5_update(pMVar7,":",1);
            sVar8 = strlen(passwdp);
            uVar4 = curlx_uztoui(sVar8);
            Curl_MD5_update(pMVar7,(uchar *)passwdp,uVar4);
            Curl_MD5_final(pMVar7,digest);
            pMVar7 = Curl_MD5_init(&Curl_DIGEST_MD5);
            if (pMVar7 != (MD5_context *)0x0) {
              Curl_MD5_update(pMVar7,digest,0x10);
              Curl_MD5_update(pMVar7,":",1);
              sVar8 = strlen(nonce);
              uVar4 = curlx_uztoui(sVar8);
              Curl_MD5_update(pMVar7,(uchar *)nonce,uVar4);
              Curl_MD5_update(pMVar7,":",1);
              sVar8 = strlen(cnonce);
              uVar4 = curlx_uztoui(sVar8);
              Curl_MD5_update(pMVar7,(uchar *)cnonce,uVar4);
              Curl_MD5_final(pMVar7,digest);
              for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
                curl_msnprintf((char *)out_00,3,"%02x",(ulong)digest[lVar11]);
                out_00 = (Curl_str *)((long)&out_00->str + 2);
              }
              puVar5 = (uchar *)Curl_auth_build_spn(service,(data->conn->host).name,(char *)0x0);
              if (puVar5 != (uchar *)0x0) {
                pMVar7 = Curl_MD5_init(&Curl_DIGEST_MD5);
                if (pMVar7 != (MD5_context *)0x0) {
                  sVar8 = strlen(method);
                  uVar4 = curlx_uztoui(sVar8);
                  Curl_MD5_update(pMVar7,(uchar *)method,uVar4);
                  Curl_MD5_update(pMVar7,":",1);
                  sVar8 = strlen((char *)puVar5);
                  uVar4 = curlx_uztoui(sVar8);
                  Curl_MD5_update(pMVar7,puVar5,uVar4);
                  Curl_MD5_final(pMVar7,digest);
                  for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
                    curl_msnprintf((char *)linep,3,"%02x",(ulong)digest[lVar11]);
                    linep = (char **)((long)linep + 2);
                  }
                  pMVar7 = Curl_MD5_init(&Curl_DIGEST_MD5);
                  if (pMVar7 != (MD5_context *)0x0) {
                    Curl_MD5_update(pMVar7,(uchar *)HA1_hex,0x20);
                    Curl_MD5_update(pMVar7,":",1);
                    sVar8 = strlen(nonce);
                    uVar4 = curlx_uztoui(sVar8);
                    Curl_MD5_update(pMVar7,(uchar *)nonce,uVar4);
                    Curl_MD5_update(pMVar7,":",1);
                    sVar8 = strlen(nonceCount);
                    uVar4 = curlx_uztoui(sVar8);
                    Curl_MD5_update(pMVar7,(uchar *)nonceCount,uVar4);
                    Curl_MD5_update(pMVar7,":",1);
                    sVar8 = strlen(cnonce);
                    uVar4 = curlx_uztoui(sVar8);
                    Curl_MD5_update(pMVar7,(uchar *)cnonce,uVar4);
                    Curl_MD5_update(pMVar7,":",1);
                    sVar8 = strlen(qop);
                    uVar4 = curlx_uztoui(sVar8);
                    Curl_MD5_update(pMVar7,(uchar *)qop,uVar4);
                    Curl_MD5_update(pMVar7,":",1);
                    Curl_MD5_update(pMVar7,(uchar *)HA2_hex,0x20);
                    Curl_MD5_final(pMVar7,digest);
                    pcVar10 = resp_hash_hex;
                    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
                      curl_msnprintf(pcVar10,3,"%02x",(ulong)digest[lVar11]);
                      pcVar10 = pcVar10 + 2;
                    }
                    pcVar10 = curl_maprintf("username=\"%s\",realm=\"%s\",nonce=\"%s\",cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,qop=%s"
                                            ,userp,realm,nonce,cnonce,nonceCount,puVar5,
                                            resp_hash_hex,qop);
                    (*Curl_cfree)(puVar5);
                    if (pcVar10 == (char *)0x0) {
                      return CURLE_OUT_OF_MEMORY;
                    }
                    sVar8 = strlen(pcVar10);
                    Curl_bufref_set(out,pcVar10,sVar8,curl_free);
                    return CURLE_OK;
                  }
                }
                (*Curl_cfree)(puVar5);
              }
            }
          }
        }
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_auth_create_digest_md5_message(struct Curl_easy *data,
                                             const struct bufref *chlg,
                                             const char *userp,
                                             const char *passwdp,
                                             const char *service,
                                             struct bufref *out)
{
  size_t i;
  struct MD5_context *ctxt;
  char *response = NULL;
  unsigned char digest[MD5_DIGEST_LEN];
  char HA1_hex[2 * MD5_DIGEST_LEN + 1];
  char HA2_hex[2 * MD5_DIGEST_LEN + 1];
  char resp_hash_hex[2 * MD5_DIGEST_LEN + 1];
  char nonce[64];
  char realm[128];
  char algorithm[64];
  char qop_options[64];
  int qop_values;
  char cnonce[33];
  char nonceCount[] = "00000001";
  char method[]     = "AUTHENTICATE";
  char qop[]        = DIGEST_QOP_VALUE_STRING_AUTH;
  char *spn         = NULL;

  /* Decode the challenge message */
  CURLcode result = auth_decode_digest_md5_message(chlg,
                                                   nonce, sizeof(nonce),
                                                   realm, sizeof(realm),
                                                   algorithm,
                                                   sizeof(algorithm),
                                                   qop_options,
                                                   sizeof(qop_options));
  if(result)
    return result;

  /* We only support md5 sessions */
  if(strcmp(algorithm, "md5-sess") != 0)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Get the qop-values from the qop-options */
  result = auth_digest_get_qop_values(qop_options, &qop_values);
  if(result)
    return result;

  /* We only support auth quality-of-protection */
  if(!(qop_values & DIGEST_QOP_VALUE_AUTH))
    return CURLE_BAD_CONTENT_ENCODING;

  /* Generate 32 random hex chars, 32 bytes + 1 null-termination */
  result = Curl_rand_hex(data, (unsigned char *)cnonce, sizeof(cnonce));
  if(result)
    return result;

  /* So far so good, now calculate A1 and H(A1) according to RFC 2831 */
  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) userp,
                  curlx_uztoui(strlen(userp)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) realm,
                  curlx_uztoui(strlen(realm)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) passwdp,
                  curlx_uztoui(strlen(passwdp)));
  Curl_MD5_final(ctxt, digest);

  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) digest, MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_final(ctxt, digest);

  /* Convert calculated 16 octet hex into 32 bytes string */
  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&HA1_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate our SPN */
  spn = Curl_auth_build_spn(service, data->conn->host.name, NULL);
  if(!spn)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate H(A2) */
  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt) {
    free(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) method,
                  curlx_uztoui(strlen(method)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) spn,
                  curlx_uztoui(strlen(spn)));
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&HA2_hex[2 * i], 3, "%02x", digest[i]);

  /* Now calculate the response hash */
  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt) {
    free(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) HA1_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) nonceCount,
                  curlx_uztoui(strlen(nonceCount)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) qop,
                  curlx_uztoui(strlen(qop)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) HA2_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&resp_hash_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate the response */
  response = aprintf("username=\"%s\",realm=\"%s\",nonce=\"%s\","
                     "cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,"
                     "qop=%s",
                     userp, realm, nonce,
                     cnonce, nonceCount, spn, resp_hash_hex, qop);
  free(spn);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Return the response. */
  Curl_bufref_set(out, response, strlen(response), curl_free);
  return result;
}